

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint extraout_EAX;
  uchar *puVar7;
  void *__ptr;
  long lVar8;
  ulong uVar9;
  uchar **extraout_RAX;
  uchar *out_00;
  uint uVar10;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  size_t bytewidth;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  uint local_288;
  ulong local_280;
  ulong local_250;
  uint local_238 [8];
  uint local_218 [8];
  uint local_1f8 [8];
  uint local_1d8 [8];
  size_t local_1b8 [8];
  size_t local_178 [7];
  size_t local_140;
  size_t local_138 [8];
  size_t local_f8 [7];
  size_t local_c0;
  size_t local_b8 [8];
  size_t local_78 [9];
  int iVar11;
  
  uVar15 = (ulong)(info_png->color).colortype;
  iVar11 = 0;
  if (uVar15 < 7) {
    iVar11 = *(int *)(&DAT_001231d4 + uVar15 * 4);
  }
  uVar10 = iVar11 * (info_png->color).bitdepth;
  if (info_png->interlace_method == 0) {
    uVar6 = uVar10 * w;
    uVar18 = (uVar6 + 7 >> 3) * h;
    uVar15 = (ulong)(uVar18 + h);
    *outsize = uVar15;
    puVar7 = (uchar *)malloc(uVar15);
    *out = puVar7;
    if ((puVar7 != (uchar *)0x0) || (*outsize == 0)) {
      if ((uVar10 < 8) && (uVar10 = uVar6 + 7 & 0xfffffff8, uVar6 != uVar10)) {
        out_00 = (uchar *)malloc((ulong)uVar18);
        if (out_00 != (uchar *)0x0) {
          addPaddingBits(out_00,in,(ulong)uVar10,(ulong)uVar6,h);
          filter(puVar7,out_00,w,h,(LodePNGColorMode *)(ulong)(info_png->color).colortype,
                 (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
        }
        free(out_00);
        return extraout_EAX;
      }
      uVar10 = filter(puVar7,in,w,h,(LodePNGColorMode *)(ulong)(info_png->color).colortype,
                      (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
      out = (uchar **)(ulong)uVar10;
    }
  }
  else {
    Adam7_getpassvalues(local_218,local_238,local_178,local_1b8,local_f8,w,h,uVar10);
    *outsize = local_140;
    puVar7 = (uchar *)malloc(local_140);
    *out = puVar7;
    __ptr = malloc(local_c0);
    if ((puVar7 != (uchar *)0x0) && (local_c0 == 0 || __ptr != (void *)0x0)) {
      Adam7_getpassvalues(local_1d8,local_1f8,local_78,local_b8,local_138,w,h,uVar10);
      if (uVar10 < 8) {
        lVar8 = 0;
        do {
          uVar6 = local_1f8[lVar8];
          if (uVar6 != 0) {
            uVar18 = local_1d8[lVar8];
            local_288 = 0;
            do {
              if ((ulong)uVar18 != 0) {
                uVar17 = ADAM7_DY[lVar8];
                uVar2 = ADAM7_IY[lVar8];
                uVar3 = ADAM7_DX[lVar8];
                sVar5 = local_138[lVar8];
                uVar4 = ADAM7_IX[lVar8];
                uVar15 = 0;
                do {
                  if (uVar10 != 0) {
                    uVar13 = (ulong)((uVar18 * local_288 + (int)uVar15) * uVar10) + sVar5 * 8;
                    uVar9 = (ulong)((uVar3 * (int)uVar15 + (uVar17 * local_288 + uVar2) * w + uVar4)
                                   * uVar10);
                    uVar12 = uVar10;
                    do {
                      bVar16 = '\x01' << (~(byte)uVar13 & 7);
                      if ((in[uVar9 >> 3] >> (~(byte)uVar9 & 7) & 1) == 0) {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 & ~bVar16;
                      }
                      else {
                        pbVar1 = (byte *)((long)__ptr + (uVar13 >> 3));
                        *pbVar1 = *pbVar1 | bVar16;
                      }
                      uVar13 = uVar13 + 1;
                      uVar9 = uVar9 + 1;
                      uVar12 = uVar12 - 1;
                    } while (uVar12 != 0);
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar18);
              }
              local_288 = local_288 + 1;
            } while (local_288 != uVar6);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else {
        uVar15 = (ulong)(uVar10 >> 3);
        lVar8 = 0;
        do {
          uVar6 = local_1f8[lVar8];
          if ((ulong)uVar6 != 0) {
            uVar9 = (ulong)local_1d8[lVar8];
            local_250 = 0;
            local_280 = 0;
            do {
              if (uVar9 != 0) {
                uVar18 = ADAM7_DX[lVar8];
                sVar5 = local_138[lVar8];
                uVar17 = (ADAM7_DY[lVar8] * (int)local_280 + ADAM7_IY[lVar8]) * w + ADAM7_IX[lVar8];
                uVar13 = uVar9;
                uVar14 = local_250;
                do {
                  memcpy((void *)((long)__ptr + (uVar14 & 0xffffffff) * uVar15 + sVar5),
                         in + uVar17 * uVar15,uVar15);
                  uVar17 = uVar17 + uVar18;
                  uVar14 = uVar14 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              local_280 = local_280 + 1;
              local_250 = local_250 + uVar9;
            } while (local_280 != uVar6);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      lVar8 = 0;
      do {
        if (uVar10 < 8) {
          puVar7 = (uchar *)malloc(*(long *)((long)local_1b8 + lVar8 * 2 + 8) -
                                   *(long *)((long)local_1b8 + lVar8 * 2));
          if (puVar7 == (uchar *)0x0) break;
          uVar6 = *(uint *)((long)local_218 + lVar8);
          uVar17 = uVar6 * uVar10;
          uVar18 = *(uint *)((long)local_238 + lVar8);
          addPaddingBits(puVar7,(uchar *)(*(long *)((long)local_f8 + lVar8 * 2) + (long)__ptr),
                         (ulong)(uVar17 + 7 & 0xfffffff8),(ulong)uVar17,uVar18);
          uVar6 = filter(*out + *(long *)((long)local_178 + lVar8 * 2),puVar7,uVar6,uVar18,
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
          free(puVar7);
        }
        else {
          uVar6 = filter(*out + *(long *)((long)local_178 + lVar8 * 2),
                         (uchar *)(*(long *)((long)local_1b8 + lVar8 * 2) + (long)__ptr),
                         *(uint *)((long)local_218 + lVar8),*(uint *)((long)local_238 + lVar8),
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
        }
        if ((uVar6 != 0) || (bVar19 = lVar8 == 0x18, lVar8 = lVar8 + 4, bVar19)) break;
      } while( true );
    }
    free(__ptr);
    out = extraout_RAX;
  }
  return (uint)out;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
	unsigned w, unsigned h,
	const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings)
{
	/*
	This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
	*) if no Adam7: 1) add padding bits (= posible extra bits per scanline if bpp < 8) 2) filter
	*) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
	*/
	unsigned bpp = lodepng_get_bpp(&info_png->color);
	unsigned error = 0;

	if (info_png->interlace_method == 0)
	{
		*outsize = h + (h * ((w * bpp + 7) / 8)); /*image size plus an extra byte per scanline + possible padding bits*/
		*out = (unsigned char*)lodepng_malloc(*outsize);
		if (!(*out) && (*outsize)) error = 83; /*alloc fail*/

		if (!error)
		{
			/*non multiple of 8 bits per scanline, padding bits needed per scanline*/
			if (bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
			{
				unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7) / 8));
				if (!padded) error = 83; /*alloc fail*/
				if (!error)
				{
					addPaddingBits(padded, in, ((w * bpp + 7) / 8) * 8, w * bpp, h);
					error = filter(*out, padded, w, h, &info_png->color, settings);
				}
				lodepng_free(padded);
			}
			else
			{
				/*we can immediately filter into the out buffer, no other steps needed*/
				error = filter(*out, in, w, h, &info_png->color, settings);
			}
		}
	}
	else /*interlace_method is 1 (Adam7)*/
	{
		unsigned passw[7], passh[7];
		size_t filter_passstart[8], padded_passstart[8], passstart[8];
		unsigned char* adam7;

		Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

		*outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
		*out = (unsigned char*)lodepng_malloc(*outsize);
		if (!(*out)) error = 83; /*alloc fail*/

		adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
		if (!adam7 && passstart[7]) error = 83; /*alloc fail*/

		if (!error)
		{
			unsigned i;

			Adam7_interlace(adam7, in, w, h, bpp);
			for (i = 0; i != 7; ++i)
			{
				if (bpp < 8)
				{
					unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
					if (!padded) ERROR_BREAK(83); /*alloc fail*/
					addPaddingBits(padded, &adam7[passstart[i]],
						((passw[i] * bpp + 7) / 8) * 8, passw[i] * bpp, passh[i]);
					error = filter(&(*out)[filter_passstart[i]], padded,
						passw[i], passh[i], &info_png->color, settings);
					lodepng_free(padded);
				}
				else
				{
					error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
						passw[i], passh[i], &info_png->color, settings);
				}

				if (error) break;
			}
		}

		lodepng_free(adam7);
	}

	return error;
}